

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

int __thiscall VPLGrammar::Parser::AndExpressionNode::GetType(AndExpressionNode *this)

{
  return 0x20;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                if (children_.size() == 1) {
                    return;
                }
                out << "    bool\n";
                int unique_id = scope->GetUnique();
                for (size_t i = 1; i < children_.size(); ++i) {
                    out << "    jz .L" << unique_id << "_end\n";
                    children_[i]->BuildProgram(scope, out);
                    out << "    bool\n";
                    out << "    and\n";
                    scope->Pop();
                }
                out << "func .L" << unique_id << "_end\n";
            }